

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O2

int main(int argc,char **argv)

{
  int sock;
  nn_options_t local_98;
  
  local_98.connect_addresses.num = 0;
  local_98.connect_addresses.to_free_num = 0;
  local_98.data_to_send.data = (char *)0x0;
  local_98.data_to_send.length = 0;
  local_98.data_to_send.need_free = 0;
  local_98.echo_format = NN_NO_ECHO;
  local_98._124_4_ = 0;
  local_98.subscriptions.num = 0;
  local_98.subscriptions.to_free_num = 0;
  local_98.socket_name = (char *)0x0;
  local_98.subscriptions.items = (char **)0x0;
  local_98.subscriptions.to_free = (char **)0x0;
  local_98.connect_addresses.items = (char **)0x0;
  local_98.connect_addresses.to_free = (char **)0x0;
  local_98.bind_addresses.to_free = (char **)0x0;
  local_98.bind_addresses.num = 0;
  local_98.bind_addresses.to_free_num = 0;
  local_98.verbose = 0;
  local_98.socket_type = 0;
  local_98.bind_addresses.items = (char **)0x0;
  local_98.send_timeout = -1.0;
  local_98.recv_timeout = -1.0;
  local_98.send_delay = 0.0;
  local_98.send_interval = -1.0;
  nn_parse_options(&nn_cli,&local_98,argc,argv);
  sock = nn_create_socket(&local_98);
  nn_connect_socket(&local_98,sock);
  nn_sleep((int)(local_98.send_delay * 1000.0));
  if (local_98.socket_type == 0x10) {
LAB_00103dcd:
    if (local_98.data_to_send.data != (char *)0x0) {
LAB_00103dd5:
      nn_rw_loop(&local_98,sock);
      goto LAB_00103deb;
    }
  }
  else {
    if (local_98.socket_type == 0x20) {
LAB_00103daf:
      nn_send_loop(&local_98,sock);
      goto LAB_00103deb;
    }
    if (local_98.socket_type != 0x21) {
      if (local_98.socket_type == 0x30) goto LAB_00103dd5;
      if (local_98.socket_type != 0x31) {
        if (local_98.socket_type == 0x70) goto LAB_00103dcd;
        if (local_98.socket_type == 0x51) goto LAB_00103de1;
        if (local_98.socket_type == 0x62) goto LAB_00103dd5;
        if (local_98.socket_type != 99) {
          if (local_98.socket_type != 0x50) goto LAB_00103deb;
          goto LAB_00103daf;
        }
      }
      if (local_98.data_to_send.data != (char *)0x0) {
        nn_resp_loop(&local_98,sock);
        goto LAB_00103dcd;
      }
    }
  }
LAB_00103de1:
  nn_recv_loop(&local_98,sock);
LAB_00103deb:
  nn_close(sock);
  nn_free_options(&nn_cli,&local_98);
  return 0;
}

Assistant:

int main (int argc, char **argv)
{
    int sock;
    nn_options_t options = {
        /* verbose           */ 0,
        /* socket_type       */ 0,
        /* bind_addresses    */ {NULL, NULL, 0, 0},
        /* connect_addresses */ {NULL, NULL, 0, 0},
        /* send_timeout      */ -1.f,
        /* recv_timeout      */ -1.f,
        /* subscriptions     */ {NULL, NULL, 0, 0},
        /* socket_name       */ NULL,
        /* send_delay        */ 0.f,
        /* send_interval     */ -1.f,
        /* data_to_send      */ {NULL, 0, 0},
        /* echo_format       */ NN_NO_ECHO
    };

    nn_parse_options (&nn_cli, &options, argc, argv);
    sock = nn_create_socket (&options);
    nn_connect_socket (&options, sock);
    nn_sleep((int)(options.send_delay*1000));
    switch (options.socket_type) {
    case NN_PUB:
    case NN_PUSH:
        nn_send_loop (&options, sock);
        break;
    case NN_SUB:
    case NN_PULL:
        nn_recv_loop (&options, sock);
        break;
    case NN_BUS:
    case NN_PAIR:
        if (options.data_to_send.data) {
            nn_rw_loop (&options, sock);
        } else {
            nn_recv_loop (&options, sock);
        }
        break;
    case NN_SURVEYOR:
    case NN_REQ:
        nn_rw_loop (&options, sock);
        break;
    case NN_REP:
    case NN_RESPONDENT:
        if (options.data_to_send.data) {
            nn_resp_loop (&options, sock);
        } else {
            nn_recv_loop (&options, sock);
        }
        break;
    }

    nn_close (sock);
    nn_free_options(&nn_cli, &options);
    return 0;
}